

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O0

Hop_Obj_t * Amap_ParseFormulaOper(Hop_Man_t *pMan,Vec_Ptr_t *pStackFn,int Oper)

{
  Hop_Obj_t *p1;
  Hop_Obj_t *p0;
  Hop_Obj_t *local_40;
  Hop_Obj_t *gFunc;
  Hop_Obj_t *gArg2;
  Hop_Obj_t *gArg1;
  int Oper_local;
  Vec_Ptr_t *pStackFn_local;
  Hop_Man_t *pMan_local;
  
  p1 = (Hop_Obj_t *)Vec_PtrPop(pStackFn);
  p0 = (Hop_Obj_t *)Vec_PtrPop(pStackFn);
  if (Oper == 9) {
    local_40 = Hop_And(pMan,p0,p1);
  }
  else if (Oper == 7) {
    local_40 = Hop_Or(pMan,p0,p1);
  }
  else {
    if (Oper != 8) {
      return (Hop_Obj_t *)0x0;
    }
    local_40 = Hop_Exor(pMan,p0,p1);
  }
  Vec_PtrPush(pStackFn,local_40);
  return local_40;
}

Assistant:

Hop_Obj_t * Amap_ParseFormulaOper( Hop_Man_t * pMan, Vec_Ptr_t * pStackFn, int Oper )
{
    Hop_Obj_t * gArg1, * gArg2, * gFunc;
    // perform the given operation
    gArg2 = (Hop_Obj_t *)Vec_PtrPop( pStackFn );
    gArg1 = (Hop_Obj_t *)Vec_PtrPop( pStackFn );
	if ( Oper == AMAP_EQN_OPER_AND )
		gFunc = Hop_And( pMan, gArg1, gArg2 );
	else if ( Oper == AMAP_EQN_OPER_OR )
		gFunc = Hop_Or( pMan, gArg1, gArg2 );
	else if ( Oper == AMAP_EQN_OPER_XOR )
		gFunc = Hop_Exor( pMan, gArg1, gArg2 );
	else
		return NULL;
//    Cudd_Ref( gFunc );
//    Cudd_RecursiveDeref( dd, gArg1 );
//    Cudd_RecursiveDeref( dd, gArg2 );
	Vec_PtrPush( pStackFn,  gFunc );
    return gFunc;
}